

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

BaseImporter * __thiscall Assimp::Importer::GetImporter(Importer *this,char *szExtension)

{
  pointer ppBVar1;
  size_t sVar2;
  BaseImporter *pBVar3;
  
  sVar2 = GetImporterIndex(this,szExtension);
  ppBVar1 = (this->pimpl->mImporter).
            super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (sVar2 < (ulong)((long)(this->pimpl->mImporter).
                            super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3)) {
    pBVar3 = ppBVar1[sVar2];
  }
  else {
    pBVar3 = (BaseImporter *)0x0;
  }
  return pBVar3;
}

Assistant:

BaseImporter* Importer::GetImporter (const char* szExtension) const
{
    return GetImporter(GetImporterIndex(szExtension));
}